

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O2

t_soundfile_type * soundfile_findtype(char *name)

{
  long lVar1;
  t_soundfile_type **pptVar2;
  t_soundfile_type *ptVar3;
  int iVar4;
  t_soundfile_type **pptVar5;
  bool bVar6;
  
  lVar1 = sf_numtypes * 8;
  pptVar5 = sf_types;
  while( true ) {
    if (pptVar5 == (t_soundfile_type **)0x0) {
      return (t_soundfile_type *)0x0;
    }
    ptVar3 = *pptVar5;
    iVar4 = strcmp(name,ptVar3->t_name);
    if (iVar4 == 0) break;
    pptVar2 = pptVar5 + 1;
    bVar6 = (t_soundfile_type **)(lVar1 + 0x1df698) != pptVar5;
    pptVar5 = (t_soundfile_type **)0x0;
    if (bVar6) {
      pptVar5 = pptVar2;
    }
  }
  return ptVar3;
}

Assistant:

static t_soundfile_type *soundfile_findtype(const char *name)
{
    t_soundfile_type **t = soundfile_firsttype();
    while (t)
    {
        if (!strcmp(name, (*t)->t_name))
            break;
        t = soundfile_nexttype(t);
    }
    return (t ? *t : NULL);
}